

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall QHttpNetworkRequest::setH2cAllowed(QHttpNetworkRequest *this,bool b)

{
  QHttpNetworkRequestPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&this->d);
  pQVar1->h2cAllowed = b;
  return;
}

Assistant:

void QHttpNetworkRequest::setH2cAllowed(bool b)
{
    d->h2cAllowed = b;
}